

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerOpenWal(Pager *pPager)

{
  int local_14;
  int rc;
  Pager *pPager_local;
  
  local_14 = 0;
  if (pPager->exclusiveMode != '\0') {
    local_14 = pagerExclusiveLock(pPager);
  }
  if (local_14 == 0) {
    local_14 = sqlite3WalOpen(pPager->pVfs,pPager->fd,pPager->zWal,(uint)pPager->exclusiveMode,
                              pPager->journalSizeLimit,&pPager->pWal);
  }
  pagerFixMaplimit(pPager);
  return local_14;
}

Assistant:

static int pagerOpenWal(Pager *pPager){
  int rc = SQLITE_OK;

  assert( pPager->pWal==0 && pPager->tempFile==0 );
  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );

  /* If the pager is already in exclusive-mode, the WAL module will use 
  ** heap-memory for the wal-index instead of the VFS shared-memory 
  ** implementation. Take the exclusive lock now, before opening the WAL
  ** file, to make sure this is safe.
  */
  if( pPager->exclusiveMode ){
    rc = pagerExclusiveLock(pPager);
  }

  /* Open the connection to the log file. If this operation fails, 
  ** (e.g. due to malloc() failure), return an error code.
  */
  if( rc==SQLITE_OK ){
    rc = sqlite3WalOpen(pPager->pVfs,
        pPager->fd, pPager->zWal, pPager->exclusiveMode,
        pPager->journalSizeLimit, &pPager->pWal
    );
  }
  pagerFixMaplimit(pPager);

  return rc;
}